

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testtool.c
# Opt level: O0

void btv(void)

{
  frameex1 *local_10;
  frameex1 *fx_addr68k;
  
  local_10 = (frameex1 *)(MachineState.pvar + -10);
  while( true ) {
    dump_stackframe(local_10);
    if (local_10->alink == 0) break;
    local_10 = get_nextFX(local_10);
  }
  printf("\n BTV end");
  return;
}

Assistant:

void btv(void) {
  struct frameex1 *fx_addr68k;
  struct frameex1 *get_nextFX(FX * fx);

  fx_addr68k = CURRENTFX;

loop:
  dump_stackframe(fx_addr68k);
  if (fx_addr68k->alink == 0) {
    printf("\n BTV end");
    return;
  }

  fx_addr68k = get_nextFX(fx_addr68k);
  goto loop;
}